

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# painter.cpp
# Opt level: O2

void __thiscall Painter::update(Painter *this)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 local_a8 [8];
  shared_ptr<mmWaveBS> dd;
  
  uVar2 = (ulong)((long)(this->m_nodes->
                        super__Vector_base<std::shared_ptr<mmWaveBS>,_std::allocator<std::shared_ptr<mmWaveBS>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_nodes->
                       super__Vector_base<std::shared_ptr<mmWaveBS>,_std::allocator<std::shared_ptr<mmWaveBS>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) >> 4;
  uVar3 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar3 = 0;
  }
  for (lVar1 = 0; uVar3 * 0x10 != lVar1; lVar1 = lVar1 + 0x10) {
    std::__shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2> *)local_a8,
               (__shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((this->m_nodes->
                         super__Vector_base<std::shared_ptr<mmWaveBS>,_std::allocator<std::shared_ptr<mmWaveBS>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar1));
    if (*(Status *)((long)local_a8 + 0xd0) == clusterHead) {
      dd.super___shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__Shape_00118d18;
      svg::Document::operator<<
                (this->m_doc,
                 (Shape *)&dd.super___shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else {
      dd.super___shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__Shape_00118d18;
      svg::Document::operator<<
                (this->m_doc,
                 (Shape *)&dd.super___shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    svg::Document::save(this->m_doc);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&dd);
  }
  return;
}

Assistant:

void Painter::update()
{
	int size = m_nodes.size();
	for(int i=0;i<size;i++)
	{
		std::shared_ptr<mmWaveBS> dd = m_nodes[i];
		double x = (0.1) * dd.get()->getX();
		double y = (0.1) * dd.get()->getY();
	
		std::size_t color = dd.get()->getColor();
		std::size_t red = (color & 0xff0000) >> 16; 
		std::size_t green =(color & 0x00ff00) >> 8; 
		std::size_t blue = (color & 0x0000ff);  	
// 		std::cout << "Status = " << dd.get()->getStatus() << std::endl;
		if(dd.get()->getStatus()==Status::clusterHead)
			*m_doc << Circle(Point(x, y), 2, Fill(Color(0,0,0)), Stroke(1, Color(red,green,blue)));
		else
			*m_doc << Circle(Point(x, y), 2, Fill(Color(red,green,blue)), Stroke(1, Color(red, green, blue)));
		
		m_doc->save();
	}
}